

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_>::rehash
          (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *this,size_t sizeHint)

{
  uchar *puVar1;
  byte bVar2;
  ulong uVar3;
  Span *pSVar4;
  Entry *pEVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  Data *pDVar9;
  Data *pDVar10;
  QString *pQVar11;
  Node<QString,_QMimeTypeXMLData> *pNVar12;
  ulong uVar13;
  size_t index;
  long lVar14;
  size_t sVar15;
  long lVar16;
  R_conflict29 RVar17;
  Bucket BVar18;
  QStringView key;
  Span *local_50;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  sVar15 = 0x80;
  if ((0x40 < sizeHint) && (sVar15 = 0xffffffffffffffff, sizeHint < 0x4000000000000000)) {
    lVar14 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    sVar15 = 1L << (0x41 - ((byte)lVar14 ^ 0x3f) & 0x3f);
  }
  uVar3 = this->numBuckets;
  pSVar4 = this->spans;
  RVar17 = allocateSpans(sVar15);
  this->spans = RVar17.spans;
  this->numBuckets = sVar15;
  if (uVar3 < 0x80) {
    if (pSVar4 == (Span *)0x0) {
      return;
    }
  }
  else {
    uVar13 = 0;
    local_50 = pSVar4;
    do {
      lVar14 = 0;
      do {
        bVar2 = local_50->offsets[lVar14];
        if ((ulong)bVar2 != 0xff) {
          pEVar5 = pSVar4[uVar13].entries;
          lVar16 = (ulong)bVar2 * 0x80 + (ulong)bVar2 * 8;
          key.m_data = *(storage_type_conflict **)((pEVar5->storage).data + lVar16 + 8);
          key.m_size = *(qsizetype *)((pEVar5->storage).data + lVar16 + 0x10);
          sVar15 = ::qHash(key,this->seed);
          BVar18 = findBucketWithHash<QString>
                             (this,(QString *)((pEVar5->storage).data + lVar16),sVar15);
          pNVar12 = Span<QHashPrivate::Node<QString,_QMimeTypeXMLData>_>::insert
                              (BVar18.span,BVar18.index);
          pDVar6 = *(Data **)((pEVar5->storage).data + lVar16);
          puVar1 = (pEVar5->storage).data + lVar16;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar12->key).d.d = pDVar6;
          pcVar7 = *(char16_t **)((pEVar5->storage).data + lVar16 + 8);
          puVar1 = (pEVar5->storage).data + lVar16 + 8;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar12->key).d.ptr = pcVar7;
          qVar8 = *(qsizetype *)((pEVar5->storage).data + lVar16 + 0x10);
          puVar1 = (pEVar5->storage).data + lVar16 + 0x10;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar12->key).d.size = qVar8;
          (pNVar12->value).hasGlobDeleteAll = (bool)(pEVar5->storage).data[lVar16 + 0x18];
          pDVar6 = *(Data **)((pEVar5->storage).data + lVar16 + 0x20);
          puVar1 = (pEVar5->storage).data + lVar16 + 0x20;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar12->value).name.d.d = pDVar6;
          pcVar7 = *(char16_t **)((pEVar5->storage).data + lVar16 + 0x28);
          puVar1 = (pEVar5->storage).data + lVar16 + 0x28;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar12->value).name.d.ptr = pcVar7;
          qVar8 = *(qsizetype *)((pEVar5->storage).data + lVar16 + 0x30);
          puVar1 = (pEVar5->storage).data + lVar16 + 0x30;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar12->value).name.d.size = qVar8;
          pDVar9 = *(Data **)((pEVar5->storage).data + lVar16 + 0x38);
          puVar1 = (pEVar5->storage).data + lVar16 + 0x38;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar12->value).localeComments.d = pDVar9;
          pDVar6 = *(Data **)((pEVar5->storage).data + lVar16 + 0x40);
          puVar1 = (pEVar5->storage).data + lVar16 + 0x40;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar12->value).genericIconName.d.d = pDVar6;
          pcVar7 = *(char16_t **)((pEVar5->storage).data + lVar16 + 0x48);
          puVar1 = (pEVar5->storage).data + lVar16 + 0x48;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar12->value).genericIconName.d.ptr = pcVar7;
          qVar8 = *(qsizetype *)((pEVar5->storage).data + lVar16 + 0x50);
          puVar1 = (pEVar5->storage).data + lVar16 + 0x50;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar12->value).genericIconName.d.size = qVar8;
          pDVar6 = *(Data **)((pEVar5->storage).data + lVar16 + 0x58);
          puVar1 = (pEVar5->storage).data + lVar16 + 0x58;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar12->value).iconName.d.d = pDVar6;
          pcVar7 = *(char16_t **)((pEVar5->storage).data + lVar16 + 0x60);
          puVar1 = (pEVar5->storage).data + lVar16 + 0x60;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar12->value).iconName.d.ptr = pcVar7;
          qVar8 = *(qsizetype *)((pEVar5->storage).data + lVar16 + 0x68);
          puVar1 = (pEVar5->storage).data + lVar16 + 0x68;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar12->value).iconName.d.size = qVar8;
          pDVar10 = *(Data **)((pEVar5->storage).data + lVar16 + 0x70);
          puVar1 = (pEVar5->storage).data + lVar16 + 0x70;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar12->value).globPatterns.d.d = pDVar10;
          pQVar11 = *(QString **)((pEVar5->storage).data + lVar16 + 0x78);
          puVar1 = (pEVar5->storage).data + lVar16 + 0x78;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar12->value).globPatterns.d.ptr = pQVar11;
          qVar8 = *(qsizetype *)((pEVar5->storage).data + lVar16 + 0x80);
          puVar1 = (pEVar5->storage).data + lVar16 + 0x80;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar12->value).globPatterns.d.size = qVar8;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x80);
      Span<QHashPrivate::Node<QString,_QMimeTypeXMLData>_>::freeData(pSVar4 + uVar13);
      uVar13 = uVar13 + 1;
      local_50 = local_50 + 1;
    } while (uVar13 != uVar3 >> 7);
  }
  lVar14 = *(long *)&pSVar4[-1].allocated;
  if (lVar14 != 0) {
    lVar16 = lVar14 * 0x90;
    do {
      Span<QHashPrivate::Node<QString,_QMimeTypeXMLData>_>::freeData
                ((Span<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)
                 (pSVar4[-1].offsets + lVar16));
      lVar16 = lVar16 + -0x90;
    } while (lVar16 != 0);
  }
  operator_delete__(&pSVar4[-1].allocated,lVar14 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }